

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# controller.h
# Opt level: O1

void __thiscall bandit::detail::controller_t::~controller_t(controller_t *this)

{
  interface *piVar1;
  interface *piVar2;
  interface *piVar3;
  interface *piVar4;
  interface *piVar5;
  
  piVar1 = (this->run_policy)._M_t.
           super___uniq_ptr_impl<bandit::run_policy::interface,_std::default_delete<bandit::run_policy::interface>_>
           ._M_t.
           super__Tuple_impl<0UL,_bandit::run_policy::interface_*,_std::default_delete<bandit::run_policy::interface>_>
           .super__Head_base<0UL,_bandit::run_policy::interface_*,_false>._M_head_impl;
  if (piVar1 != (interface *)0x0) {
    (*piVar1->_vptr_interface[1])();
  }
  (this->run_policy)._M_t.
  super___uniq_ptr_impl<bandit::run_policy::interface,_std::default_delete<bandit::run_policy::interface>_>
  ._M_t.
  super__Tuple_impl<0UL,_bandit::run_policy::interface_*,_std::default_delete<bandit::run_policy::interface>_>
  .super__Head_base<0UL,_bandit::run_policy::interface_*,_false>._M_head_impl = (interface *)0x0;
  piVar2 = (this->reporter)._M_t.
           super___uniq_ptr_impl<bandit::reporter::interface,_std::default_delete<bandit::reporter::interface>_>
           ._M_t.
           super__Tuple_impl<0UL,_bandit::reporter::interface_*,_std::default_delete<bandit::reporter::interface>_>
           .super__Head_base<0UL,_bandit::reporter::interface_*,_false>._M_head_impl;
  if (piVar2 != (interface *)0x0) {
    (*piVar2->_vptr_interface[1])();
  }
  (this->reporter)._M_t.
  super___uniq_ptr_impl<bandit::reporter::interface,_std::default_delete<bandit::reporter::interface>_>
  ._M_t.
  super__Tuple_impl<0UL,_bandit::reporter::interface_*,_std::default_delete<bandit::reporter::interface>_>
  .super__Head_base<0UL,_bandit::reporter::interface_*,_false>._M_head_impl = (interface *)0x0;
  piVar3 = (this->formatter)._M_t.
           super___uniq_ptr_impl<bandit::failure_formatter::interface,_std::default_delete<bandit::failure_formatter::interface>_>
           ._M_t.
           super__Tuple_impl<0UL,_bandit::failure_formatter::interface_*,_std::default_delete<bandit::failure_formatter::interface>_>
           .super__Head_base<0UL,_bandit::failure_formatter::interface_*,_false>._M_head_impl;
  if (piVar3 != (interface *)0x0) {
    (*piVar3->_vptr_interface[1])();
  }
  (this->formatter)._M_t.
  super___uniq_ptr_impl<bandit::failure_formatter::interface,_std::default_delete<bandit::failure_formatter::interface>_>
  ._M_t.
  super__Tuple_impl<0UL,_bandit::failure_formatter::interface_*,_std::default_delete<bandit::failure_formatter::interface>_>
  .super__Head_base<0UL,_bandit::failure_formatter::interface_*,_false>._M_head_impl =
       (interface *)0x0;
  piVar4 = (this->colorizer)._M_t.
           super___uniq_ptr_impl<bandit::colorizer::interface,_std::default_delete<bandit::colorizer::interface>_>
           ._M_t.
           super__Tuple_impl<0UL,_bandit::colorizer::interface_*,_std::default_delete<bandit::colorizer::interface>_>
           .super__Head_base<0UL,_bandit::colorizer::interface_*,_false>._M_head_impl;
  if (piVar4 != (interface *)0x0) {
    (*piVar4->_vptr_interface[1])();
  }
  (this->colorizer)._M_t.
  super___uniq_ptr_impl<bandit::colorizer::interface,_std::default_delete<bandit::colorizer::interface>_>
  ._M_t.
  super__Tuple_impl<0UL,_bandit::colorizer::interface_*,_std::default_delete<bandit::colorizer::interface>_>
  .super__Head_base<0UL,_bandit::colorizer::interface_*,_false>._M_head_impl = (interface *)0x0;
  piVar5 = (this->adapter)._M_t.
           super___uniq_ptr_impl<bandit::adapter::interface,_std::default_delete<bandit::adapter::interface>_>
           ._M_t.
           super__Tuple_impl<0UL,_bandit::adapter::interface_*,_std::default_delete<bandit::adapter::interface>_>
           .super__Head_base<0UL,_bandit::adapter::interface_*,_false>._M_head_impl;
  if (piVar5 != (interface *)0x0) {
    (*piVar5->_vptr_interface[1])();
  }
  (this->adapter)._M_t.
  super___uniq_ptr_impl<bandit::adapter::interface,_std::default_delete<bandit::adapter::interface>_>
  ._M_t.
  super__Tuple_impl<0UL,_bandit::adapter::interface_*,_std::default_delete<bandit::adapter::interface>_>
  .super__Head_base<0UL,_bandit::adapter::interface_*,_false>._M_head_impl = (interface *)0x0;
  std::_Deque_base<bandit::context::interface_*,_std::allocator<bandit::context::interface_*>_>::
  ~_Deque_base((_Deque_base<bandit::context::interface_*,_std::allocator<bandit::context::interface_*>_>
                *)this);
  return;
}

Assistant:

context::stack_t& get_contexts() {
        return context_stack;
      }